

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageIOTests.cpp
# Opt level: O3

void __thiscall dit::ImageReadCase::~ImageReadCase(ImageReadCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__ImageReadCase_00270d90;
  pcVar2 = (this->m_filename)._M_dataplus._M_p;
  paVar1 = &(this->m_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ImageReadCase (tcu::TestContext& testCtx, const char* name, const char* filename, deUint32 expectedHash)
		: TestCase			(testCtx, name, filename)
		, m_filename		(filename)
		, m_expectedHash	(expectedHash)
	{
	}